

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::paramCheckFixStorage
          (TParseContext *this,TSourceLoc *loc,TStorageQualifier *qualifier,TType *type)

{
  TStorageQualifier TVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar3;
  TType *type_local;
  TStorageQualifier *qualifier_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  TVar1 = *qualifier;
  if (TVar1 < EvqConst) {
    iVar2 = (*type->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var_01,iVar2) + 8) =
         *(ulong *)(CONCAT44(extraout_var_01,iVar2) + 8) & 0xffffffffffffff80 | 0x10;
    return;
  }
  if (TVar1 == EvqConst) {
LAB_0069b6db:
    iVar2 = (*type->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var,iVar2) + 8) =
         *(ulong *)(CONCAT44(extraout_var,iVar2) + 8) & 0xffffffffffffff80 | 0x13;
  }
  else {
    if (2 < TVar1 - EvqIn) {
      if (TVar1 == EvqConstReadOnly) goto LAB_0069b6db;
      if (TVar1 != EvqTileImageEXT) {
        iVar2 = (*type->_vptr_TType[10])();
        *(ulong *)(CONCAT44(extraout_var_02,iVar2) + 8) =
             *(ulong *)(CONCAT44(extraout_var_02,iVar2) + 8) & 0xffffffffffffff80 | 0x10;
        pcVar3 = GetStorageQualifierString(*qualifier);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"storage qualifier not allowed on function parameter",pcVar3,"");
        return;
      }
    }
    TVar1 = *qualifier;
    iVar2 = (*type->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var_00,iVar2) + 8) =
         *(ulong *)(CONCAT44(extraout_var_00,iVar2) + 8) & 0xffffffffffffff80 | (ulong)TVar1 & 0x7f;
  }
  return;
}

Assistant:

void TParseContext::paramCheckFixStorage(const TSourceLoc& loc, const TStorageQualifier& qualifier, TType& type)
{
    switch (qualifier) {
    case EvqConst:
    case EvqConstReadOnly:
        type.getQualifier().storage = EvqConstReadOnly;
        break;
    case EvqIn:
    case EvqOut:
    case EvqInOut:
    case EvqTileImageEXT:
        type.getQualifier().storage = qualifier;
        break;
    case EvqGlobal:
    case EvqTemporary:
        type.getQualifier().storage = EvqIn;
        break;
    default:
        type.getQualifier().storage = EvqIn;
        error(loc, "storage qualifier not allowed on function parameter", GetStorageQualifierString(qualifier), "");
        break;
    }
}